

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

int GetExecutorResultInt(uint tempStackType,uint *tempStackArrayBase)

{
  int value;
  uint *tempStackArrayBase_local;
  uint tempStackType_local;
  
  if (tempStackType - 1 < 4) {
    return *tempStackArrayBase;
  }
  __assert_fail("!\"return type is not \'int\'\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_Common.cpp"
                ,0x6d4,"int GetExecutorResultInt(unsigned int, unsigned int *)");
}

Assistant:

int GetExecutorResultInt(unsigned tempStackType, unsigned *tempStackArrayBase)
{
	int value = 0;

	switch(tempStackType)
	{
	case NULLC_TYPE_BOOL:
	case NULLC_TYPE_CHAR:
	case NULLC_TYPE_SHORT:
	case NULLC_TYPE_INT:
		memcpy(&value, tempStackArrayBase, sizeof(value));
		return value;
	default:
		assert(!"return type is not 'int'");
		break;
	}

	return value;
}